

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O1

void __thiscall Ptex::v2_4::PtexReader::readEditMetaData(PtexReader *this)

{
  pointer *ppMVar1;
  iterator __position;
  pointer pMVar2;
  bool bVar3;
  EditMetaDataHeader emdh;
  undefined8 local_20;
  MetaEdit local_18;
  
  bVar3 = readBlock(this,&local_20,8,true);
  if (bVar3) {
    local_18.pos = 0;
    local_18.zipsize = 0;
    local_18.memsize = 0;
    __position._M_current =
         (this->_metaedits).
         super__Vector_base<Ptex::v2_4::PtexReader::MetaEdit,_std::allocator<Ptex::v2_4::PtexReader::MetaEdit>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->_metaedits).
        super__Vector_base<Ptex::v2_4::PtexReader::MetaEdit,_std::allocator<Ptex::v2_4::PtexReader::MetaEdit>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<Ptex::v2_4::PtexReader::MetaEdit,_std::allocator<Ptex::v2_4::PtexReader::MetaEdit>_>::
      _M_realloc_insert<Ptex::v2_4::PtexReader::MetaEdit>(&this->_metaedits,__position,&local_18);
    }
    else {
      (__position._M_current)->pos = 0;
      (__position._M_current)->zipsize = 0;
      (__position._M_current)->memsize = 0;
      ppMVar1 = &(this->_metaedits).
                 super__Vector_base<Ptex::v2_4::PtexReader::MetaEdit,_std::allocator<Ptex::v2_4::PtexReader::MetaEdit>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppMVar1 = *ppMVar1 + 1;
    }
    pMVar2 = (this->_metaedits).
             super__Vector_base<Ptex::v2_4::PtexReader::MetaEdit,_std::allocator<Ptex::v2_4::PtexReader::MetaEdit>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pMVar2[-1].pos = this->_pos;
    pMVar2[-1].zipsize = (undefined4)local_20;
    pMVar2[-1].memsize = local_20._4_4_;
  }
  return;
}

Assistant:

void PtexReader::readEditMetaData()
{
    // read header
    EditMetaDataHeader emdh;
    if (!readBlock(&emdh, EditMetaDataHeaderSize)) return;

    // record header info for later
    _metaedits.push_back(MetaEdit());
    MetaEdit& e = _metaedits.back();
    e.pos = tell();
    e.zipsize = emdh.metadatazipsize;
    e.memsize = emdh.metadatamemsize;
}